

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicCode.cpp
# Opt level: O3

void __thiscall
RhombicCode::sweepFullVertex
          (RhombicCode *this,int vertexIndex,vstr *sweepEdges,string *sweepDirection,
          vstr *upEdgeDirections)

{
  uniform_int_distribution<int> *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  size_t sVar4;
  size_t sVar5;
  string *psVar6;
  result_type_conflict rVar7;
  int iVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  ulong uVar10;
  invalid_argument *this_00;
  ulong uVar11;
  long lVar12;
  size_t __n;
  long *plVar13;
  pointer pcVar14;
  pointer __s1;
  pointer pbVar15;
  size_type sVar16;
  pointer pbVar17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  vint vertices;
  allocator_type local_1f1;
  RhombicCode *local_1f0;
  int local_1e4;
  vint local_1e0;
  string *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  long *local_180 [2];
  long local_170 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar3 = (upEdgeDirections->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar15 = (sweepEdges->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1f0 = this;
  local_1e4 = vertexIndex;
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (pbVar15,(sweepEdges->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,sweepDirection);
  pbVar17 = (sweepEdges->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (long)(sweepEdges->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar17;
  local_1c8 = sweepDirection;
  if (uVar11 == 0x80) {
    paVar2 = &local_1c0.field_2;
    pcVar14 = (sweepDirection->_M_dataplus)._M_p;
    local_1c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,pcVar14,pcVar14 + sweepDirection->_M_string_length);
    local_1a0[0] = local_190;
    pcVar14 = (pbVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,pcVar14,pcVar14 + pbVar3->_M_string_length);
    plVar13 = local_170;
    pcVar14 = (pbVar3->_M_dataplus)._M_p;
    local_180[0] = plVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_180,pcVar14,pcVar14 + pbVar3->_M_string_length);
    __l._M_len = 3;
    __l._M_array = &local_1c0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,__l,&local_1f1);
    psVar6 = local_1c8;
    Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    lVar12 = -0x60;
    do {
      if (plVar13 != (long *)plVar13[-2]) {
        operator_delete((long *)plVar13[-2],*plVar13 + 1);
      }
      plVar13 = plVar13 + -4;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0);
    Code::localFlip(&local_1f0->super_Code,&local_1e0);
    if (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pcVar14 = (psVar6->_M_dataplus)._M_p;
    local_1c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,pcVar14,pcVar14 + psVar6->_M_string_length);
    local_1a0[0] = local_190;
    pcVar14 = pbVar3[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,pcVar14,pcVar14 + pbVar3[1]._M_string_length);
    plVar13 = local_170;
    pcVar14 = pbVar3[1]._M_dataplus._M_p;
    local_180[0] = plVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_180,pcVar14,pcVar14 + pbVar3[1]._M_string_length);
    __l_00._M_len = 3;
    __l_00._M_array = &local_1c0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,__l_00,&local_1f1);
    psVar6 = local_1c8;
    Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    lVar12 = -0x60;
    do {
      if (plVar13 != (long *)plVar13[-2]) {
        operator_delete((long *)plVar13[-2],*plVar13 + 1);
      }
      plVar13 = plVar13 + -4;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0);
    Code::localFlip(&local_1f0->super_Code,&local_1e0);
    if (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pcVar14 = (psVar6->_M_dataplus)._M_p;
    local_1c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,pcVar14,pcVar14 + psVar6->_M_string_length);
    local_1a0[0] = local_190;
    pcVar14 = pbVar3[2]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,pcVar14,pcVar14 + pbVar3[2]._M_string_length);
    plVar13 = local_170;
    pcVar14 = pbVar3[2]._M_dataplus._M_p;
    local_180[0] = plVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_180,pcVar14,pcVar14 + pbVar3[2]._M_string_length);
    __l_01._M_len = 3;
    __l_01._M_array = &local_1c0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_78,__l_01,&local_1f1);
    Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    lVar12 = -0x60;
    do {
      if (plVar13 != (long *)plVar13[-2]) {
        operator_delete((long *)plVar13[-2],*plVar13 + 1);
      }
      plVar13 = plVar13 + -4;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0);
    Code::localFlip(&local_1f0->super_Code,&local_1e0);
    goto LAB_001148ac;
  }
  uVar10 = (long)_Var9._M_current - (long)pbVar15;
  if (uVar10 < uVar11) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(sweepEdges,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pbVar17 + uVar10));
    pbVar15 = (sweepEdges->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(sweepEdges->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 == 0x40) {
      puVar1 = &(local_1f0->super_Code).distInt0To1;
      rVar7 = std::uniform_int_distribution<int>::operator()
                        (puVar1,&(local_1f0->super_Code).rnEngine,&puVar1->_M_param);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(sweepEdges,
                 (sweepEdges->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + rVar7);
      pbVar15 = (sweepEdges->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    sVar4 = pbVar15->_M_string_length;
    if (sVar4 == pbVar3->_M_string_length) {
      if (sVar4 != 0) {
        iVar8 = bcmp((pbVar15->_M_dataplus)._M_p,(pbVar3->_M_dataplus)._M_p,sVar4);
        if (iVar8 != 0) goto LAB_00113e13;
      }
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      pcVar14 = (sweepDirection->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,pcVar14,pcVar14 + sweepDirection->_M_string_length);
      local_1a0[0] = local_190;
      pcVar14 = (pbVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,pcVar14,pcVar14 + pbVar3->_M_string_length);
      plVar13 = local_170;
      pcVar14 = (pbVar3->_M_dataplus)._M_p;
      local_180[0] = plVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_180,pcVar14,pcVar14 + pbVar3->_M_string_length);
      __l_05._M_len = 3;
      __l_05._M_array = &local_1c0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_90,__l_05,&local_1f1);
      Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_90);
      lVar12 = -0x60;
      do {
        if (plVar13 != (long *)plVar13[-2]) {
          operator_delete((long *)plVar13[-2],*plVar13 + 1);
        }
        plVar13 = plVar13 + -4;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0);
      Code::localFlip(&local_1f0->super_Code,&local_1e0);
      goto LAB_001148ac;
    }
LAB_00113e13:
    if (sVar4 == pbVar3[2]._M_string_length) {
      if (sVar4 != 0) {
        iVar8 = bcmp((pbVar15->_M_dataplus)._M_p,pbVar3[2]._M_dataplus._M_p,sVar4);
        if (iVar8 != 0) goto LAB_00113e39;
      }
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      pcVar14 = (sweepDirection->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,pcVar14,pcVar14 + sweepDirection->_M_string_length);
      local_1a0[0] = local_190;
      pcVar14 = pbVar3[2]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,pcVar14,pcVar14 + pbVar3[2]._M_string_length);
      plVar13 = local_170;
      pcVar14 = pbVar3[2]._M_dataplus._M_p;
      local_180[0] = plVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_180,pcVar14,pcVar14 + pbVar3[2]._M_string_length);
      __l_06._M_len = 3;
      __l_06._M_array = &local_1c0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a8,__l_06,&local_1f1);
      Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8);
      lVar12 = -0x60;
      do {
        if (plVar13 != (long *)plVar13[-2]) {
          operator_delete((long *)plVar13[-2],*plVar13 + 1);
        }
        plVar13 = plVar13 + -4;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0);
      Code::localFlip(&local_1f0->super_Code,&local_1e0);
      goto LAB_001148ac;
    }
LAB_00113e39:
    if (sVar4 != pbVar3[1]._M_string_length) {
LAB_001148f3:
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Invalid up-edges.");
      goto LAB_0011490f;
    }
    if (sVar4 != 0) {
      iVar8 = bcmp((pbVar15->_M_dataplus)._M_p,pbVar3[1]._M_dataplus._M_p,sVar4);
      if (iVar8 != 0) goto LAB_001148f3;
    }
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    pcVar14 = (sweepDirection->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,pcVar14,pcVar14 + sweepDirection->_M_string_length);
    local_1a0[0] = local_190;
    pcVar14 = pbVar3[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,pcVar14,pcVar14 + pbVar3[1]._M_string_length);
    plVar13 = local_170;
    pcVar14 = pbVar3[1]._M_dataplus._M_p;
    local_180[0] = plVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_180,pcVar14,pcVar14 + pbVar3[1]._M_string_length);
    __l_02._M_len = 3;
    __l_02._M_array = &local_1c0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c0,__l_02,&local_1f1);
    Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    lVar12 = -0x60;
    do {
      if (plVar13 != (long *)plVar13[-2]) {
        operator_delete((long *)plVar13[-2],*plVar13 + 1);
      }
      plVar13 = plVar13 + -4;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0);
    Code::localFlip(&local_1f0->super_Code,&local_1e0);
    goto LAB_001148ac;
  }
  if (uVar11 == 0x60) {
    puVar1 = &(local_1f0->super_Code).distInt0To2;
    rVar7 = std::uniform_int_distribution<int>::operator()
                      (puVar1,&(local_1f0->super_Code).rnEngine,&puVar1->_M_param);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(sweepEdges,
               (sweepEdges->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + rVar7);
    pbVar17 = (sweepEdges->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  sVar4 = pbVar17->_M_string_length;
  __n = pbVar3->_M_string_length;
  if (sVar4 == __n) {
    if (sVar4 != 0) {
      iVar8 = bcmp((pbVar17->_M_dataplus)._M_p,(pbVar3->_M_dataplus)._M_p,sVar4);
      if (iVar8 != 0) goto LAB_00113fc6;
    }
    sVar5 = pbVar17[1]._M_string_length;
    if (sVar5 != pbVar3[2]._M_string_length) goto LAB_00113fc6;
    if (sVar5 != 0) {
      iVar8 = bcmp(pbVar17[1]._M_dataplus._M_p,pbVar3[2]._M_dataplus._M_p,sVar5);
      if (iVar8 != 0) goto LAB_00113fc6;
    }
    goto LAB_00114501;
  }
LAB_00113fc6:
  local_170[2] = pbVar3[2]._M_string_length;
  if (sVar4 == local_170[2]) {
    if (sVar4 != 0) {
      iVar8 = bcmp((pbVar17->_M_dataplus)._M_p,pbVar3[2]._M_dataplus._M_p,sVar4);
      if (iVar8 != 0) goto LAB_00114016;
    }
    if (pbVar17[1]._M_string_length == __n) {
      if (__n != 0) {
        iVar8 = bcmp(pbVar17[1]._M_dataplus._M_p,(pbVar3->_M_dataplus)._M_p,__n);
        if (iVar8 != 0) goto LAB_00114016;
      }
LAB_00114501:
      pcVar14 = (local_1c8->_M_dataplus)._M_p;
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,pcVar14,pcVar14 + local_1c8->_M_string_length);
      local_1a0[0] = local_190;
      pcVar14 = (pbVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,pcVar14,pcVar14 + pbVar3->_M_string_length);
      plVar13 = local_170;
      pcVar14 = (pbVar3->_M_dataplus)._M_p;
      local_180[0] = plVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_180,pcVar14,pcVar14 + pbVar3->_M_string_length);
      __l_07._M_len = 3;
      __l_07._M_array = &local_1c0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_d8,__l_07,&local_1f1);
      psVar6 = local_1c8;
      Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      lVar12 = -0x60;
      do {
        if (plVar13 != (long *)plVar13[-2]) {
          operator_delete((long *)plVar13[-2],*plVar13 + 1);
        }
        plVar13 = plVar13 + -4;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0);
      Code::localFlip(&local_1f0->super_Code,&local_1e0);
      if (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pcVar14 = (psVar6->_M_dataplus)._M_p;
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,pcVar14,pcVar14 + psVar6->_M_string_length);
      local_1a0[0] = local_190;
      pcVar14 = pbVar3[2]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,pcVar14,pcVar14 + pbVar3[2]._M_string_length);
      plVar13 = local_170;
      pcVar14 = pbVar3[2]._M_dataplus._M_p;
      local_180[0] = plVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_180,pcVar14,pcVar14 + pbVar3[2]._M_string_length);
      __l_08._M_len = 3;
      __l_08._M_array = &local_1c0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_f0,__l_08,&local_1f1);
      Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      lVar12 = -0x60;
      do {
        if (plVar13 != (long *)plVar13[-2]) {
          operator_delete((long *)plVar13[-2],*plVar13 + 1);
        }
        plVar13 = plVar13 + -4;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0);
      Code::localFlip(&local_1f0->super_Code,&local_1e0);
      goto LAB_001148ac;
    }
  }
LAB_00114016:
  if (sVar4 == __n) {
    if (sVar4 != 0) {
      iVar8 = bcmp((pbVar17->_M_dataplus)._M_p,(pbVar3->_M_dataplus)._M_p,sVar4);
      if (iVar8 != 0) goto LAB_0011405b;
    }
    sVar5 = pbVar17[1]._M_string_length;
    if (sVar5 != pbVar3[1]._M_string_length) goto LAB_0011405b;
    if (sVar5 != 0) {
      iVar8 = bcmp(pbVar17[1]._M_dataplus._M_p,pbVar3[1]._M_dataplus._M_p,sVar5);
      if (iVar8 != 0) goto LAB_0011405b;
    }
    goto LAB_001146d9;
  }
LAB_0011405b:
  sVar5 = pbVar3[1]._M_string_length;
  if (sVar4 == sVar5) {
    if (sVar4 == 0) {
LAB_0011409c:
      sVar16 = pbVar17[1]._M_string_length;
      if (sVar16 == __n) {
        if (__n != 0) {
          iVar8 = bcmp(pbVar17[1]._M_dataplus._M_p,(pbVar3->_M_dataplus)._M_p,__n);
          if (iVar8 != 0) goto LAB_001140c6;
        }
LAB_001146d9:
        pcVar14 = (local_1c8->_M_dataplus)._M_p;
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c0,pcVar14,pcVar14 + local_1c8->_M_string_length);
        local_1a0[0] = local_190;
        pcVar14 = (pbVar3->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a0,pcVar14,pcVar14 + pbVar3->_M_string_length);
        plVar13 = local_170;
        pcVar14 = (pbVar3->_M_dataplus)._M_p;
        local_180[0] = plVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_180,pcVar14,pcVar14 + pbVar3->_M_string_length);
        __l_09._M_len = 3;
        __l_09._M_array = &local_1c0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_108,__l_09,&local_1f1);
        psVar6 = local_1c8;
        Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_108);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_108);
        lVar12 = -0x60;
        do {
          if (plVar13 != (long *)plVar13[-2]) {
            operator_delete((long *)plVar13[-2],*plVar13 + 1);
          }
          plVar13 = plVar13 + -4;
          lVar12 = lVar12 + 0x20;
        } while (lVar12 != 0);
        Code::localFlip(&local_1f0->super_Code,&local_1e0);
        if (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        pcVar14 = (psVar6->_M_dataplus)._M_p;
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c0,pcVar14,pcVar14 + psVar6->_M_string_length);
        local_1a0[0] = local_190;
        pcVar14 = pbVar3[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a0,pcVar14,pcVar14 + pbVar3[1]._M_string_length);
        plVar13 = local_170;
        pcVar14 = pbVar3[1]._M_dataplus._M_p;
        local_180[0] = plVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_180,pcVar14,pcVar14 + pbVar3[1]._M_string_length);
        __l_10._M_len = 3;
        __l_10._M_array = &local_1c0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_120,__l_10,&local_1f1);
        Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_120);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_120);
        lVar12 = -0x60;
        do {
          if (plVar13 != (long *)plVar13[-2]) {
            operator_delete((long *)plVar13[-2],*plVar13 + 1);
          }
          plVar13 = plVar13 + -4;
          lVar12 = lVar12 + 0x20;
        } while (lVar12 != 0);
        Code::localFlip(&local_1f0->super_Code,&local_1e0);
        goto LAB_001148ac;
      }
LAB_001140c6:
      if (sVar4 != 0) {
        pcVar14 = pbVar3[1]._M_dataplus._M_p;
        __s1 = (pbVar17->_M_dataplus)._M_p;
        goto LAB_001140d2;
      }
    }
    else {
      pcVar14 = pbVar3[1]._M_dataplus._M_p;
      __s1 = (pbVar17->_M_dataplus)._M_p;
      local_170[3] = __n;
      iVar8 = bcmp(__s1,pcVar14,sVar4);
      __n = local_170[3];
      if (iVar8 == 0) goto LAB_0011409c;
LAB_001140d2:
      iVar8 = bcmp(__s1,pcVar14,sVar4);
      if (iVar8 != 0) goto LAB_00114110;
      sVar16 = pbVar17[1]._M_string_length;
    }
    if (sVar16 != local_170[2]) goto LAB_00114110;
    if (local_170[2] != 0) {
      iVar8 = bcmp(pbVar17[1]._M_dataplus._M_p,pbVar3[2]._M_dataplus._M_p,local_170[2]);
      if (iVar8 != 0) goto LAB_00114110;
    }
    goto LAB_00114161;
  }
LAB_00114110:
  if (sVar4 == local_170[2]) {
    if (sVar4 != 0) {
      iVar8 = bcmp((pbVar17->_M_dataplus)._M_p,pbVar3[2]._M_dataplus._M_p,sVar4);
      if (iVar8 != 0) goto LAB_001148d5;
    }
    if (pbVar17[1]._M_string_length == sVar5) {
      if (sVar5 != 0) {
        iVar8 = bcmp(pbVar17[1]._M_dataplus._M_p,pbVar3[1]._M_dataplus._M_p,sVar5);
        if (iVar8 != 0) goto LAB_001148d5;
      }
LAB_00114161:
      pcVar14 = (local_1c8->_M_dataplus)._M_p;
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,pcVar14,pcVar14 + local_1c8->_M_string_length);
      local_1a0[0] = local_190;
      pcVar14 = pbVar3[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,pcVar14,pcVar14 + pbVar3[1]._M_string_length);
      plVar13 = local_170;
      pcVar14 = pbVar3[1]._M_dataplus._M_p;
      local_180[0] = plVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_180,pcVar14,pcVar14 + pbVar3[1]._M_string_length);
      __l_03._M_len = 3;
      __l_03._M_array = &local_1c0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_138,__l_03,&local_1f1);
      psVar6 = local_1c8;
      Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_138);
      lVar12 = -0x60;
      do {
        if (plVar13 != (long *)plVar13[-2]) {
          operator_delete((long *)plVar13[-2],*plVar13 + 1);
        }
        plVar13 = plVar13 + -4;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0);
      Code::localFlip(&local_1f0->super_Code,&local_1e0);
      if (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pcVar14 = (psVar6->_M_dataplus)._M_p;
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,pcVar14,pcVar14 + psVar6->_M_string_length);
      local_1a0[0] = local_190;
      pcVar14 = pbVar3[2]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,pcVar14,pcVar14 + pbVar3[2]._M_string_length);
      plVar13 = local_170;
      pcVar14 = pbVar3[2]._M_dataplus._M_p;
      local_180[0] = plVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_180,pcVar14,pcVar14 + pbVar3[2]._M_string_length);
      __l_04._M_len = 3;
      __l_04._M_array = &local_1c0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_150,__l_04,&local_1f1);
      Code::faceVertices(&local_1e0,&local_1f0->super_Code,local_1e4,&local_150);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_150);
      lVar12 = -0x60;
      do {
        if (plVar13 != (long *)plVar13[-2]) {
          operator_delete((long *)plVar13[-2],*plVar13 + 1);
        }
        plVar13 = plVar13 + -4;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0);
      Code::localFlip(&local_1f0->super_Code,&local_1e0);
LAB_001148ac:
      if (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
  }
LAB_001148d5:
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Invalid up-edges.");
LAB_0011490f:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void RhombicCode::sweepFullVertex(const int vertexIndex, vstr &sweepEdges, const std::string &sweepDirection, const vstr &upEdgeDirections)
{
    // std::cout << "Sweep of coordinate = " << lattice->indexToCoordinate(vertexIndex) << " ... ";
    auto &edge0 = upEdgeDirections[0];
    auto &edge1 = upEdgeDirections[1];
    auto &edge2 = upEdgeDirections[2];
    // cartesian4 coordinate = lattice->indexToCoordinate(vertexIndex);
    auto sweepDirectionIndex = std::distance(sweepEdges.begin(), std::find(sweepEdges.begin(), sweepEdges.end(), sweepDirection));
    if (sweepEdges.size() == 4)
    {
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
    }
    else if (sweepDirectionIndex < sweepEdges.size())
    {
        sweepEdges.erase(sweepEdges.begin() + sweepDirectionIndex);
        if (sweepEdges.size() == 2)
        {
            // int delIndex = distInt0To1(mt);
            int delIndex = distInt0To1(rnEngine);
            sweepEdges.erase(sweepEdges.begin() + delIndex);
        }
        if (sweepEdges[0] == edge0)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if (sweepEdges[0] == edge2)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if (sweepEdges[0] == edge1)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else
        {
            throw std::invalid_argument("Invalid up-edges.");
        }
    }
    else
    {
        if (sweepEdges.size() == 3)
        {
            // int delIndex = distInt0To2(mt);
            int delIndex = distInt0To2(rnEngine);
            sweepEdges.erase(sweepEdges.begin() + delIndex);
        }
        if ((sweepEdges[0] == edge0 && sweepEdges[1] == edge2) ||
            (sweepEdges[0] == edge2 && sweepEdges[1] == edge0))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if ((sweepEdges[0] == edge0 && sweepEdges[1] == edge1) ||
                 (sweepEdges[0] == edge1 && sweepEdges[1] == edge0))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if ((sweepEdges[0] == edge1 && sweepEdges[1] == edge2) ||
                 (sweepEdges[0] == edge2 && sweepEdges[1] == edge1))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else
        {
            throw std::invalid_argument("Invalid up-edges.");
        }
    }
    // std::cout << "Successful." << std::endl;
}